

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *
wasm::WATParser::inlineExports
          (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *__return_storage_ptr__,
          Lexer *in)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  string_view expected;
  undefined1 auStack_c0 [8];
  optional<wasm::Name> name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  void *local_68;
  iterator iStack_60;
  Name *local_58;
  Err local_50;
  
  local_68 = (void *)0x0;
  iStack_60._M_current = (Name *)0x0;
  local_58 = (Name *)0x0;
  while( true ) {
    expected._M_str = "export";
    expected._M_len = 6;
    bVar3 = Lexer::takeSExprStart(in,expected);
    if (!bVar3) {
      *(void **)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> = local_68;
      *(Name **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 8) =
           iStack_60._M_current;
      *(Name **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x10) =
           local_58;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    Lexer::takeName((optional<wasm::Name> *)auStack_c0,in);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') break;
    bVar3 = Lexer::takeRParen(in);
    if (!bVar3) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"expected end of import","");
      Lexer::err(&local_50,in,&local_88);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> = puVar1;
      paVar2 = &local_50.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.msg._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                           local_50.msg.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x18) =
             local_50.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> =
             local_50.msg._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x10) =
             CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                      local_50.msg.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 8) =
           local_50.msg._M_string_length;
      local_50.msg._M_string_length = 0;
      local_50.msg.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20) = '\x01';
      local_98._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
      _Var4._M_p = local_88._M_dataplus._M_p;
      local_50.msg._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00b899b2;
      goto LAB_00b899aa;
    }
    if (iStack_60._M_current == local_58) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_68,iStack_60,
                 (Name *)auStack_c0);
    }
    else {
      ((iStack_60._M_current)->super_IString).str._M_len = (size_t)auStack_c0;
      ((iStack_60._M_current)->super_IString).str._M_str =
           (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
  }
  name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._16_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged,"expected export name","");
  Lexer::err(&local_50,in,
             (string *)
             &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).
    super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
    super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> = puVar1;
  paVar2 = &local_50.msg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.msg._M_dataplus._M_p == paVar2) {
    *puVar1 = CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                       local_50.msg.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
             super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x18) =
         local_50.msg.field_2._8_8_;
  }
  else {
    *(pointer *)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> =
         local_50.msg._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x10) =
         CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                  local_50.msg.field_2._M_local_buf[0]);
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 8) =
       local_50.msg._M_string_length;
  local_50.msg._M_string_length = 0;
  local_50.msg.field_2._M_local_buf[0] = '\0';
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20) = '\x01';
  _Var4._M_p = (pointer)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._16_8_;
  local_50.msg._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._16_8_ == &local_98) goto LAB_00b899b2;
LAB_00b899aa:
  local_50.msg._M_dataplus._M_p = (pointer)&local_50.msg.field_2;
  local_50.msg.field_2._M_local_buf[0] = '\0';
  local_50.msg._M_string_length = 0;
  operator_delete(_Var4._M_p,local_98._M_allocated_capacity + 1);
LAB_00b899b2:
  if (local_68 == (void *)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_68,(long)local_58 - (long)local_68);
  return __return_storage_ptr__;
}

Assistant:

inline Result<std::vector<Name>> inlineExports(Lexer& in) {
  std::vector<Name> exports;
  while (in.takeSExprStart("export"sv)) {
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of import");
    }
    exports.push_back(*name);
  }
  return exports;
}